

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  gulps_output *this;
  _List_node_base *p_Var2;
  gulps_async_file_output *this_00;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  string local_f8;
  undefined1 local_d8 [32];
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char local_98 [16];
  _Alloc_hider local_88;
  char local_78 [24];
  _Alloc_hider local_60;
  char local_50 [16];
  _Alloc_hider local_40;
  char local_30 [24];
  
  if (gulps::inst()::inst == '\0') {
    main_cold_1();
  }
  pcVar1 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"TEST","");
  if ((char)in_FS_OFFSET[-1] == '\0') {
    main_cold_2();
  }
  std::__cxx11::string::_M_assign((string *)(*in_FS_OFFSET + -0x28));
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  this = (gulps_output *)operator_new(0x28);
  (this->filters).
  super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->filters).
  super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->filters).
  super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_vptr_gulps_output = (_func_int **)&PTR__gulps_output_00144a68;
  *(undefined1 *)&this[1]._vptr_gulps_output = 1;
  *(undefined4 *)((long)&this[1]._vptr_gulps_output + 4) = 0xff;
  gulps::gulps_output::add_filter(this,main::$_0::__invoke(gulps::message_const__);
  if (gulps::inst()::inst == '\0') {
    main_cold_3();
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  gulps::inst()::inst._16_8_ = gulps::inst()::inst._16_8_ + 1;
  this_00 = (gulps_async_file_output *)operator_new(0x2f8);
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"out.txt","");
  gulps::gulps_async_file_output::gulps_async_file_output(this_00,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  gulps::gulps_output::add_filter
            ((gulps_output *)this_00,main::$_1::__invoke(gulps::message_const__);
  if (gulps::inst()::inst == '\0') {
    main_cold_4();
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  gulps::inst()::inst._16_8_ = gulps::inst()::inst._16_8_ + 1;
  if (gulps::inst()::inst == '\0') {
    main_cold_5();
  }
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"test-out","");
  gulps::message::message
            ((message *)local_d8,LEVEL_OUTPUT_0,"ab","abc",
             "/workspace/llm4binary/github/license_all_cmakelists_25/fireice-uk[P]gulps/main.cpp",
             0x189,&local_f8,red);
  gulps::log((gulps *)gulps::inst()::inst,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (local_40._M_p != local_30) {
    operator_delete(local_40._M_p);
  }
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_a8._M_p != local_98) {
    operator_delete(local_a8._M_p);
  }
  if ((undefined1 *)local_d8._16_8_ != local_b8) {
    operator_delete((void *)local_d8._16_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) 
{
	gulps::inst().set_thread_tag("TEST");
	std::unique_ptr<gulps::gulps_output> out(new gulps::gulps_print_output(true, fmt::color::blue));
	out->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out));

	std::unique_ptr<gulps::gulps_output> out2(new gulps::gulps_async_file_output("out.txt"));
	out2->add_filter([](const gulps::message& msg) -> bool { return true; });
	gulps::inst().add_output(std::move(out2));
	
	gulps::inst().log(gulps::message(gulps::LEVEL_OUTPUT_0, "ab", "abc", __FILE__, __LINE__, "test-out", fmt::color::red));
}